

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O3

int flatcc_verify_table_as_root(void *buf,size_t bufsiz,char *fid,flatcc_table_verifier_f *tvf)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  flatcc_table_verifier_descriptor_t local_38;
  
  iVar1 = flatcc_verify_buffer_header(buf,bufsiz,fid);
  if (iVar1 == 0) {
    local_38.table = *buf;
    uVar2 = (ulong)local_38.table;
    local_38.ttl = 99;
    iVar1 = 0xf;
    if (uVar2 != 0) {
      local_38.end = (flatbuffers_uoffset_t)bufsiz;
      if ((local_38.table & 3) == 0 && uVar2 + 4 <= (bufsiz & 0xffffffff)) {
        uVar3 = local_38.table - *(int *)((long)buf + uVar2);
        uVar2 = (ulong)uVar3;
        iVar1 = 0x1d;
        if ((uVar3 & 1) == 0 && -1 < (int)uVar3) {
          iVar1 = 0x1b;
          if (uVar2 + 2 <= (bufsiz & 0xffffffff)) {
            local_38.vsize = *(ushort *)((long)buf + uVar2);
            iVar1 = 0x1e;
            if (((local_38.vsize & 1) == 0 && uVar3 + local_38.vsize <= local_38.end) &&
               (iVar1 = 0x1c, 3 < local_38.vsize)) {
              local_38.tsize = *(ushort *)((long)buf + uVar2 + 2);
              iVar1 = 0x14;
              if ((uint)local_38.tsize <= local_38.end - local_38.table) {
                local_38.vtable = (void *)(uVar2 + (long)buf);
                local_38.buf = buf;
                iVar1 = (*tvf)(&local_38);
              }
            }
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int flatcc_verify_table_as_root(const void *buf, size_t bufsiz, const char *fid, flatcc_table_verifier_f *tvf)
{
    check_result(flatcc_verify_buffer_header(buf, bufsiz, fid));
    return verify_table(buf, (uoffset_t)bufsiz, 0, read_uoffset(buf, 0), FLATCC_VERIFIER_MAX_LEVELS, tvf);
}